

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Mocap::Compute_array_dt
          (ChFunction_Mocap *this,ChArray<> *array_A,ChArray<> *array_A_dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  Index index;
  ulong index_00;
  uint uVar7;
  
  index_00 = 0;
  while ((long)index_00 < (long)this->samples) {
    uVar7 = (uint)(index_00 + 1);
    uVar4 = (uint)index_00;
    if ((int)uVar7 < this->samples) {
      uVar4 = uVar7;
    }
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)array_A,
                        (ulong)uVar4);
    dVar1 = *pdVar5;
    index = 0;
    if (1 < index_00) {
      index = index_00 - 1;
    }
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)array_A,index);
    dVar2 = this->samp_freq;
    dVar3 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)array_A_dt,
                        index_00);
    *pSVar6 = (dVar1 - dVar3) / (1.0 / dVar2);
    index_00 = index_00 + 1;
  }
  return;
}

Assistant:

void ChFunction_Mocap::Compute_array_dt(const ChArray<>& array_A, ChArray<>& array_A_dt) const {
    int i, ia, ib;
    double y_dt;

    for (i = 0; i < samples; i++) {
        ia = i - 1;  // boundaries cases
        if (ia <= 0) {
            ia = 0;
        }
        ib = i + 1;
        if (ib >= samples) {
            ib = i;
        }
        // trapezoidal differentiation
        y_dt = ((array_A(ib)) - (array_A(ia))) / Get_timeslice();

        array_A_dt(i) = y_dt;
    }
}